

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O2

void CESkyCoord::Galactic2Observed
               (CESkyCoord *in_galactic,CESkyCoord *out_observed,CEDate *date,CEObserver *observer,
               CESkyCoord *observed_galactic,CEAngle *hour_angle)

{
  CESkyCoord obs_cirs;
  CESkyCoord tmp_cirs;
  CESkyCoord local_90;
  CESkyCoord local_60;
  
  CESkyCoord(&local_60);
  Galactic2CIRS(in_galactic,&local_60,date);
  CESkyCoord(&local_90);
  CIRS2Observed(&local_60,out_observed,date,observer,&local_90,hour_angle);
  if (observed_galactic != (CESkyCoord *)0x0) {
    CIRS2Galactic(&local_90,observed_galactic,date);
  }
  ~CESkyCoord(&local_90);
  ~CESkyCoord(&local_60);
  return;
}

Assistant:

void CESkyCoord::Galactic2Observed(const CESkyCoord& in_galactic,
                                   CESkyCoord*       out_observed,
                                   const CEDate&     date,
                                   const CEObserver& observer,
                                   CESkyCoord*       observed_galactic,
                                   CEAngle*          hour_angle)
{
    // Galactic -> CIRS
    CESkyCoord tmp_cirs;
    Galactic2CIRS(in_galactic, &tmp_cirs, date);

    // CIRS -> OBSERVED
    CESkyCoord obs_cirs;
    CIRS2Observed(tmp_cirs, out_observed, date, 
                  observer, &obs_cirs, hour_angle);

    // Observed CIRS -> observed Galactic
    if (observed_galactic != nullptr) {
        CIRS2Galactic(obs_cirs, observed_galactic, date);
    }

    return;
}